

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeTcpIpLink.cpp
# Opt level: O3

void xe::TcpIpLink::keepaliveTimerCallback(void *ptr)

{
  deUint64 dVar1;
  deUint64 dVar2;
  size_t __n;
  deUint8 hdr [8];
  deUint8 local_20 [8];
  
  dVar1 = TcpIpLinkState::getLastKeepaliveRecevied((TcpIpLinkState *)((long)ptr + 0x10));
  dVar2 = deGetMicroseconds();
  if (30000000 < (long)(dVar2 - dVar1)) {
    TcpIpLinkState::setState
              ((TcpIpLinkState *)((long)ptr + 0x10),COMMLINKSTATE_ERROR,"Keepalive timeout");
  }
  __n = 8;
  xs::Message::writeHeader(MESSAGETYPE_KEEPALIVE,8,local_20,8);
  de::BlockBuffer<unsigned_char>::write
            ((BlockBuffer<unsigned_char> *)((long)ptr + 0x90),8,local_20,__n);
  de::BlockBuffer<unsigned_char>::flush((BlockBuffer<unsigned_char> *)((long)ptr + 0x90));
  return;
}

Assistant:

void TcpIpLink::keepaliveTimerCallback (void* ptr)
{
	TcpIpLink*	link			= static_cast<TcpIpLink*>(ptr);
	deUint64	lastKeepalive	= link->m_state.getLastKeepaliveRecevied();
	deUint64	curTime			= deGetMicroseconds();

	// Check for timeout.
	if ((deInt64)curTime-(deInt64)lastKeepalive > xs::KEEPALIVE_TIMEOUT*1000)
		link->m_state.setState(COMMLINKSTATE_ERROR, "Keepalive timeout");

	// Enqueue new keepalive.
	try
	{
		writeKeepalive(link->m_sendThread.getBuffer());
	}
	catch (const de::BlockBuffer<deUint8>::CanceledException&)
	{
		// Ignore. Can happen in connection teardown.
	}
}